

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxesTest(Gia_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  bool bVar3;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  Gia_ManCleanMark01(p);
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 != 0) {
      *(ulong *)pGStack_20 =
           *(ulong *)pGStack_20 & 0xffffffffbfffffff | ((long)local_24 % 5 & 1U) << 0x1e;
      *(ulong *)pGStack_20 =
           *(ulong *)pGStack_20 & 0xbfffffffffffffff | ((long)local_24 % 7 & 1U) << 0x3e;
      if (((*(ulong *)pGStack_20 >> 0x1e & 1) != 0) && ((*(ulong *)pGStack_20 >> 0x3e & 1) != 0)) {
        *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xbfffffffffffffff;
        *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xffffffffbfffffff;
      }
    }
    local_24 = local_24 + 1;
  }
  pGVar2 = Gia_ManDupWithArtificalFaddBoxes(p,0,0);
  Gia_ManCleanMark01(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxesTest( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // label some and-gates
    Gia_ManCleanMark01( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->fMark0 = i % 5;
        pObj->fMark1 = i % 7;
        if ( pObj->fMark0 && pObj->fMark1 )
            pObj->fMark0 = pObj->fMark1 = 0;
    }

    // output new AIG
    pNew = Gia_ManDupWithArtificalFaddBoxes( p, 0, 0 );
    Gia_ManCleanMark01( p );
    return pNew;
}